

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

bool __thiscall QCss::Parser::parseElementName(Parser *this,QString *name)

{
  long lVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  TokenType TVar5;
  bool bVar6;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (long)this->index + -1;
  TVar5 = NONE;
  if (lVar1 < (this->symbols).d.size) {
    TVar5 = (this->symbols).d.ptr[lVar1].token;
  }
  if (TVar5 == IDENT) {
    Symbol::lexem(&local_38,(this->symbols).d.ptr + (long)this->index + -1);
    pQVar2 = &((name->d).d)->super_QArrayData;
    pcVar3 = (name->d).ptr;
    (name->d).d = local_38.d.d;
    (name->d).ptr = local_38.d.ptr;
    qVar4 = (name->d).size;
    (name->d).size = local_38.d.size;
    local_38.d.d = (Data *)pQVar2;
    local_38.d.ptr = pcVar3;
    local_38.d.size = qVar4;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    bVar6 = true;
  }
  else if (TVar5 == STAR) {
    bVar6 = true;
    if ((name->d).ptr != (char16_t *)0x0) {
      pQVar2 = &((name->d).d)->super_QArrayData;
      (name->d).d = (Data *)0x0;
      (name->d).ptr = (char16_t *)0x0;
      (name->d).size = 0;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
    }
  }
  else {
    bVar6 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool Parser::parseElementName(QString *name)
{
    switch (lookup()) {
        case STAR: name->clear(); break;
        case IDENT: *name = lexem(); break;
        default: return false;
    }
    return true;
}